

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

RegNum __thiscall
LinearScan::SpillLiveRange(LinearScan *this,Lifetime *spilledRange,Instr *insertionInstr)

{
  RegNum reg;
  uint32 uVar1;
  uint uVar2;
  uint32 uVar3;
  StackSym *this_00;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  ushort uVar7;
  uint uVar8;
  uint functionId;
  undefined4 *puVar9;
  
  uVar7 = *(ushort *)&spilledRange->field_0x9c;
  if ((uVar7 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb13,"(!spilledRange->isSpilled)","!spilledRange->isSpilled");
    if (!bVar5) goto LAB_00535964;
    *puVar9 = 0;
    uVar7 = *(ushort *)&spilledRange->field_0x9c;
  }
  reg = spilledRange->reg;
  this_00 = spilledRange->sym;
  *(ushort *)&spilledRange->field_0x9c = (uVar7 & 0xfbfe) + 1;
  spilledRange->reg = RegNOREG;
  if ((this_00->field_0x19 & 0x10) == 0) {
    bVar5 = StackSym::IsConst(this_00);
    if (bVar5) {
      bVar5 = IsSymNonTempLocalVar(this,this_00);
      if (!bVar5) goto LAB_005356af;
    }
    AllocateStackSpace(this,spilledRange);
  }
LAB_005356af:
  if ((spilledRange->field_0x9c & 8) == 0) {
    bVar5 = IsSymNonTempLocalVar(this,this_00);
    if (!bVar5) {
      InsertStores(this,spilledRange,reg,insertionInstr);
    }
    if (this->loopNest == 0) {
      bVar5 = StackSym::IsConst(this_00);
      if (bVar5) goto LAB_005356f2;
      SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear
                ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
                 ((long)this_00->scratch + 0x30));
    }
    else {
LAB_005356f2:
      InsertLoads(this,this_00,reg);
    }
    Lifetime::ApplyUseCountAdjust(spilledRange,this->curLoop);
  }
  if (reg == RegNOREG) {
    if ((spilledRange->field_0x9d & 2) != 0) goto LAB_0053589b;
  }
  else {
    if ((spilledRange->reg != RegNOREG) && (this->regContent[reg] != spilledRange)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xb38,
                         "(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange)"
                         ,
                         "reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange"
                        );
      if (!bVar5) goto LAB_00535964;
      *puVar9 = 0;
    }
    if ((spilledRange->field_0x9d & 2) != 0) {
      if (spilledRange->reg != RegNOREG) {
        if (this->regContent[reg] == spilledRange) {
          BVar6 = BVUnitT<unsigned_long>::Test(&this->secondChanceRegs,(uint)reg);
          if (BVar6 != '\0') goto LAB_0053589b;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0xb3c,
                           "(reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)))"
                           ,
                           "reg == RegNOREG || spilledRange->reg == RegNOREG || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg))"
                          );
        if (!bVar5) goto LAB_00535964;
        *puVar9 = 0;
      }
LAB_0053589b:
      BVUnitT<unsigned_long>::Clear(&this->secondChanceRegs,(uint)reg);
      spilledRange->field_0x9d = spilledRange->field_0x9d & 0xfd;
      goto LAB_005358ae;
    }
  }
  BVar6 = BVUnitT<unsigned_long>::Test(&this->secondChanceRegs,(uint)reg);
  if (BVar6 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xb42,"(!this->secondChanceRegs.Test(reg))",
                       "!this->secondChanceRegs.Test(reg)");
    if (!bVar5) {
LAB_00535964:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
LAB_005358ae:
  this->regContent[reg] = (Lifetime *)0x0;
  uVar8 = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,LinearScanPhase,uVar8,functionId);
  if (bVar5) {
    Output::Print(L"**** Spill: ");
    Sym::Dump(&this_00->super_Sym,(ValueType)0x9);
    Output::Print(L"(%S)",RegNames[reg]);
    uVar1 = spilledRange->end;
    uVar2 = spilledRange->useCount;
    uVar3 = spilledRange->start;
    uVar8 = GetSpillCost(this,spilledRange);
    Output::Print(L"  SpillCount:%d  Length:%d   Cost:%d\n",(ulong)uVar2,(ulong)(uVar1 - uVar3),
                  (ulong)uVar8);
  }
  return reg;
}

Assistant:

RegNum
LinearScan::SpillLiveRange(Lifetime * spilledRange, IR::Instr *insertionInstr)
{
    Assert(!spilledRange->isSpilled);

    RegNum reg = spilledRange->reg;
    StackSym *sym = spilledRange->sym;

    spilledRange->isSpilled = true;
    spilledRange->isCheapSpill = false;
    spilledRange->reg = RegNOREG;

    // Don't allocate stack space for const, we always reload them. (For debugm mode, allocate on the stack)
    if (!sym->IsAllocated() && (!sym->IsConst() || IsSymNonTempLocalVar(sym)))
    {
       this->AllocateStackSpace(spilledRange);
    }

    // No need to insert loads or stores if there are no uses.
    if (!spilledRange->isDeadStore)
    {
        // In the debug mode, don't do insertstore for this stacksym, as we want to retain the IsConst for the sym,
        // and later we are going to find the reg for it.
        if (!IsSymNonTempLocalVar(sym))
        {
            this->InsertStores(spilledRange, reg, insertionInstr);
        }

        if (this->IsInLoop() || sym->IsConst())
        {
            this->InsertLoads(sym, reg);
        }
        else
        {
            sym->scratch.linearScan.lifetime->useList.Clear();
        }
        // Adjust useCount in case of second chance allocation
        spilledRange->ApplyUseCountAdjust(this->curLoop);
    }

    Assert(reg == RegNOREG || spilledRange->reg == RegNOREG || this->regContent[reg] == spilledRange);
    if (spilledRange->isSecondChanceAllocated)
    {
        Assert(reg == RegNOREG || spilledRange->reg == RegNOREG
            || (this->regContent[reg] == spilledRange && this->secondChanceRegs.Test(reg)));
        this->secondChanceRegs.Clear(reg);
        spilledRange->isSecondChanceAllocated = false;
    }
    else
    {
        Assert(!this->secondChanceRegs.Test(reg));
    }
    this->regContent[reg] = nullptr;

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        Output::Print(_u("**** Spill: "));
        sym->Dump();
        Output::Print(_u("(%S)"), RegNames[reg]);
        Output::Print(_u("  SpillCount:%d  Length:%d   Cost:%d\n"),
            spilledRange->useCount, spilledRange->end - spilledRange->start, this->GetSpillCost(spilledRange));
    }
#endif
    return reg;
}